

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O0

bool __thiscall ON_Viewport::IsValid(ON_Viewport *this,ON_TextLog *text_log)

{
  bool bVar1;
  ON_TextLog *text_log_local;
  ON_Viewport *this_local;
  
  bVar1 = IsValidCamera(this);
  if (bVar1) {
    bVar1 = IsValidFrustum(this);
    if (bVar1) {
      if ((this->m_bValidPort & 1U) == 0) {
        if (text_log != (ON_TextLog *)0x0) {
          ON_TextLog::Print(text_log,"invalid viewport port extents settings.\n");
        }
        this_local._7_1_ = false;
      }
      else {
        this_local._7_1_ = true;
      }
    }
    else {
      if (text_log != (ON_TextLog *)0x0) {
        ON_TextLog::Print(text_log,"invalid viewport frustum settings.\n");
      }
      this_local._7_1_ = false;
    }
  }
  else {
    if (text_log != (ON_TextLog *)0x0) {
      ON_TextLog::Print(text_log,"invalid viewport camera settings.\n");
    }
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_Viewport::IsValid( ON_TextLog* text_log ) const
{
  if ( !IsValidCamera() )
  {
    if ( 0 != text_log )
    {
      text_log->Print("invalid viewport camera settings.\n");
    }
    return false;
  }
  if ( !IsValidFrustum() )
  {
    if ( 0 != text_log )
    {
      text_log->Print("invalid viewport frustum settings.\n");
    }
    return false;
  }
  if ( !m_bValidPort )
  {
    if ( 0 != text_log )
    {
      text_log->Print("invalid viewport port extents settings.\n");
    }
    return false;
  }
  return true;
}